

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

float If_CutAreaFlow(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  If_LibLut_t *pIVar2;
  uint *puVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar1 = *(uint *)&pCut->field_0x1c;
  if ((short)uVar1 < 0) {
    fVar5 = (float)p->pPars->nAndArea;
  }
  else if ((uVar1 >> 0xd & 1) == 0) {
    pIVar2 = p->pPars->pLutLib;
    if (pIVar2 == (If_LibLut_t *)0x0) {
      fVar5 = 1.0;
    }
    else {
      fVar5 = pIVar2->pLutAreas[uVar1 >> 0x18];
    }
  }
  else {
    fVar5 = (float)(uVar1 & 0xfff);
  }
  if (0xffffff < uVar1) {
    uVar4 = 0;
    fVar6 = fVar5;
    do {
      fVar5 = (&pCut[1].Area)[uVar4];
      if (((long)(int)fVar5 < 0) || (p->vObjs->nSize <= (int)fVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (uint *)p->vObjs->pArray[(int)fVar5];
      if (puVar3 == (uint *)0x0) {
        return fVar6;
      }
      if ((puVar3[3] == 0) || ((*puVar3 & 0xf) == 1)) {
        fVar7 = (float)puVar3[0x14];
      }
      else {
        fVar7 = (float)puVar3[0xc];
        if (fVar7 < p->fEpsilon || fVar7 == p->fEpsilon) {
          __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x3a3,"float If_CutAreaFlow(If_Man_t *, If_Cut_t *)");
        }
        fVar7 = (float)puVar3[0x14] / fVar7;
      }
      fVar5 = 1e+32;
      if (((fVar6 < 1e+32) && (fVar5 = 1e+32, fVar7 < 1e+32)) &&
         (fVar5 = fVar6 + fVar7, 1e+32 < fVar5)) {
        fVar5 = 1e+32;
      }
      uVar4 = uVar4 + 1;
      fVar6 = fVar5;
    } while (uVar1 >> 0x18 != uVar4);
  }
  return fVar5;
}

Assistant:

float If_CutAreaFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow, AddOn;
    int i;
    Flow = If_CutLutArea(p, pCut);
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            AddOn = If_ObjCutBest(pLeaf)->Area;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            AddOn = If_ObjCutBest(pLeaf)->Area / pLeaf->EstRefs;
        }
        if ( Flow >= (float)1e32 || AddOn >= (float)1e32 )
            Flow = (float)1e32;
        else 
        {
            Flow += AddOn;
            if ( Flow > (float)1e32 )
                 Flow = (float)1e32;
        }
    }
    return Flow;
}